

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ribbon_artist.cpp
# Opt level: O3

RibbonArtist * __thiscall polyscope::RibbonArtist::setMaterial(RibbonArtist *this,string *mat)

{
  ShaderProgram *program;
  
  PersistentValue<std::__cxx11::string>::operator=
            ((PersistentValue<std::__cxx11::string> *)&this->material,mat);
  program = (this->program).
            super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (program != (ShaderProgram *)0x0) {
    render::Engine::setMaterial(render::engine,program,&(this->material).value);
    requestRedraw();
  }
  return this;
}

Assistant:

RibbonArtist* RibbonArtist::setMaterial(std::string mat) {
  material = mat;
  if (program) {
    render::engine->setMaterial(*program, material.get());
    requestRedraw();
  }
  return this;
}